

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O3

xcb_generic_iterator_t xcb_input_feedback_state_end(xcb_input_feedback_state_iterator_t i)

{
  int iVar1;
  ulong uVar2;
  xcb_input_feedback_state_t *R;
  uint uVar3;
  ulong uVar4;
  xcb_input_feedback_state_t *pxVar5;
  long in_FS_OFFSET;
  xcb_generic_iterator_t xVar6;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  anon_struct_8_4_ea8d086f_for_pointer local_68;
  undefined1 *puStack_60;
  xcb_keysym_t *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_30;
  
  uVar4 = i._8_8_;
  pxVar5 = i.data;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (i.rem < 1) {
    uVar2 = uVar4 >> 0x20;
  }
  else {
    uVar3 = i.rem + 1;
    uVar4 = 0;
    do {
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = (xcb_keysym_t *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = (anon_struct_8_4_ea8d086f_for_pointer)&DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
      iVar1 = xcb_input_feedback_state_data_unpack
                        (pxVar5 + 1,pxVar5->class_id,(xcb_input_feedback_state_data_t *)&local_98);
      uVar2 = (ulong)(iVar1 + 4);
      pxVar5 = (xcb_input_feedback_state_t *)(&pxVar5->class_id + uVar2);
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  xVar6._8_8_ = uVar4 & 0xffffffff | uVar2 << 0x20;
  xVar6.data = pxVar5;
  return xVar6;
}

Assistant:

xcb_generic_iterator_t
xcb_input_feedback_state_end (xcb_input_feedback_state_iterator_t i)
{
    xcb_generic_iterator_t ret;
    while(i.rem > 0)
        xcb_input_feedback_state_next(&i);
    ret.data = i.data;
    ret.rem = i.rem;
    ret.index = i.index;
    return ret;
}